

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Ch *s,SizeType length,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  GenericStringRef<char> GVar1;
  StringRefType s_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_local;
  SizeType length_local;
  Ch *s_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  (this->data_).s.str = (Ch *)0x0;
  *(undefined8 *)((long)&this->data_ + 8) = 0;
  this->flags_ = 0;
  GVar1 = StringRef<char>(s,(ulong)length);
  s_00._12_4_ = 0;
  s_00.s = (Ch *)SUB128(GVar1._0_12_,0);
  s_00.length = SUB124(GVar1._0_12_,8);
  SetStringRaw(this,s_00,allocator);
  return;
}

Assistant:

GenericValue(const Ch* s, SizeType length, Allocator& allocator) : data_(), flags_() { SetStringRaw(StringRef(s, length), allocator); }